

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

void png_create_colormap_entry
               (png_image_read_control *display,png_uint_32 ip,png_uint_32 red,png_uint_32 green,
               png_uint_32 blue,png_uint_32 alpha,int encoding)

{
  png_fixed_point gamma_val;
  png_imagep paVar1;
  png_voidp pvVar2;
  png_uint_16 pVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool local_5b;
  bool local_5a;
  png_bytep entry_1;
  png_uint_16p entry;
  int bgr;
  int afirst;
  png_uint_32 y;
  png_fixed_point g;
  int convert_to_Y;
  int output_encoding;
  png_imagep image;
  uint local_20;
  png_uint_32 alpha_local;
  png_uint_32 blue_local;
  png_uint_32 green_local;
  png_uint_32 red_local;
  png_uint_32 ip_local;
  png_image_read_control *display_local;
  
  paVar1 = display->image;
  iVar4 = 1;
  if ((paVar1->format & 4) != 0) {
    iVar4 = 2;
  }
  local_5a = false;
  if ((paVar1->format & 2) == 0) {
    local_5a = red != green || green != blue;
  }
  if (0xff < ip) {
    png_error(paVar1->opaque->png_ptr,"color-map index out of range");
  }
  if (encoding == 3) {
    if (display->file_encoding == 0) {
      set_file_encoding(display);
    }
    encoding = display->file_encoding;
  }
  image._4_4_ = alpha;
  if (encoding == 3) {
    gamma_val = display->gamma_to_linear;
    pVar3 = png_gamma_16bit_correct(red * 0x101,gamma_val);
    blue_local = (png_uint_32)pVar3;
    pVar3 = png_gamma_16bit_correct(green * 0x101,gamma_val);
    alpha_local = (png_uint_32)pVar3;
    pVar3 = png_gamma_16bit_correct(blue * 0x101,gamma_val);
    local_20 = (uint)pVar3;
    if ((local_5a) || (iVar4 == 2)) {
      image._4_4_ = alpha * 0x101;
      encoding = 2;
    }
    else {
      blue_local = (uint)png_sRGB_base[blue_local * 0xff >> 0xf] +
                   ((blue_local * 0xff & 0x7fff) * (uint)png_sRGB_delta[blue_local * 0xff >> 0xf] >>
                   0xc) >> 8 & 0xff;
      alpha_local = (uint)png_sRGB_base[alpha_local * 0xff >> 0xf] +
                    ((alpha_local * 0xff & 0x7fff) * (uint)png_sRGB_delta[alpha_local * 0xff >> 0xf]
                    >> 0xc) >> 8 & 0xff;
      local_20 = (uint)png_sRGB_base[local_20 * 0xff >> 0xf] +
                 ((local_20 * 0xff & 0x7fff) * (uint)png_sRGB_delta[local_20 * 0xff >> 0xf] >> 0xc)
                 >> 8 & 0xff;
      encoding = 1;
    }
  }
  else if (encoding == 4) {
    blue_local = red * 0x101;
    alpha_local = green * 0x101;
    local_20 = blue * 0x101;
    image._4_4_ = alpha * 0x101;
    encoding = 2;
  }
  else {
    local_20 = blue;
    alpha_local = green;
    blue_local = red;
    if ((encoding == 1) && ((local_5a || (iVar4 == 2)))) {
      blue_local = (png_uint_32)png_sRGB_table[red];
      alpha_local = (png_uint_32)png_sRGB_table[green];
      local_20 = (uint)png_sRGB_table[blue];
      image._4_4_ = alpha * 0x101;
      encoding = 2;
    }
  }
  if (encoding == 2) {
    if (local_5a) {
      iVar5 = blue_local * 0x1b38 + alpha_local * 0x5b8a + local_20 * 0x93e;
      if (iVar4 == 2) {
        bgr = iVar5 + 0x4000U >> 0xf;
      }
      else {
        iVar5 = (iVar5 + 0x80U >> 8) * 0xff;
        bgr = (uint)png_sRGB_base[iVar5 + 0x40U >> 0x16] +
              ((iVar5 + 0x40U >> 7 & 0x7fff) * (uint)png_sRGB_delta[iVar5 + 0x40U >> 0x16] >> 0xc)
              >> 8 & 0xff;
        image._4_4_ = image._4_4_ * 0xff + 0x807f >> 0x10;
        encoding = 1;
      }
      alpha_local = bgr;
      blue_local = bgr;
      local_20 = bgr;
    }
    else if (iVar4 == 1) {
      blue_local = (uint)png_sRGB_base[blue_local * 0xff >> 0xf] +
                   ((blue_local * 0xff & 0x7fff) * (uint)png_sRGB_delta[blue_local * 0xff >> 0xf] >>
                   0xc) >> 8 & 0xff;
      alpha_local = (uint)png_sRGB_base[alpha_local * 0xff >> 0xf] +
                    ((alpha_local * 0xff & 0x7fff) * (uint)png_sRGB_delta[alpha_local * 0xff >> 0xf]
                    >> 0xc) >> 8 & 0xff;
      local_20 = (uint)png_sRGB_base[local_20 * 0xff >> 0xf] +
                 ((local_20 * 0xff & 0x7fff) * (uint)png_sRGB_delta[local_20 * 0xff >> 0xf] >> 0xc)
                 >> 8 & 0xff;
      image._4_4_ = image._4_4_ * 0xff + 0x807f >> 0x10;
      encoding = 1;
    }
  }
  if (encoding == iVar4) {
    local_5b = false;
    if ((paVar1->format & 0x20) != 0) {
      local_5b = (paVar1->format & 1) != 0;
    }
    uVar6 = (uint)local_5b;
    uVar7 = 0;
    if ((paVar1->format & 0x10) != 0) {
      uVar7 = 2;
    }
    if (iVar4 == 2) {
      pvVar2 = display->colormap;
      uVar8 = ip * ((paVar1->format & 3) + 1);
      switch(paVar1->format & 3) {
      case 1:
        *(short *)((long)pvVar2 + (long)(int)(uVar6 ^ 1) * 2 + (ulong)uVar8 * 2) =
             (short)image._4_4_;
      case 0:
        if (image._4_4_ < 0xffff) {
          if (image._4_4_ == 0) {
            alpha_local = 0;
          }
          else {
            alpha_local = (alpha_local * image._4_4_ + 0x7fff) / 0xffff;
          }
        }
        *(short *)((long)pvVar2 + (long)(int)uVar6 * 2 + (ulong)uVar8 * 2) = (short)alpha_local;
        break;
      case 3:
        iVar4 = 3;
        if (uVar6 != 0) {
          iVar4 = 0;
        }
        *(short *)((long)pvVar2 + (long)iVar4 * 2 + (ulong)uVar8 * 2) = (short)image._4_4_;
      case 2:
        if (image._4_4_ < 0xffff) {
          if (image._4_4_ == 0) {
            local_20 = 0;
            alpha_local = 0;
            blue_local = 0;
          }
          else {
            local_20 = (local_20 * image._4_4_ + 0x7fff) / 0xffff;
            alpha_local = (alpha_local * image._4_4_ + 0x7fff) / 0xffff;
            blue_local = (blue_local * image._4_4_ + 0x7fff) / 0xffff;
          }
        }
        *(short *)((long)pvVar2 + (long)(int)(uVar6 + (uVar7 ^ 2)) * 2 + (ulong)uVar8 * 2) =
             (short)local_20;
        *(short *)((long)pvVar2 + (long)(int)(uVar6 + 1) * 2 + (ulong)uVar8 * 2) =
             (short)alpha_local;
        *(short *)((long)pvVar2 + (long)(int)(uVar6 + uVar7) * 2 + (ulong)uVar8 * 2) =
             (short)blue_local;
      }
    }
    else {
      pvVar2 = display->colormap;
      uVar8 = ip * ((paVar1->format & 3) + 1);
      switch(paVar1->format & 3) {
      case 1:
        *(char *)((long)pvVar2 + (long)(int)(uVar6 ^ 1) + (ulong)uVar8) = (char)image._4_4_;
      case 0:
        *(char *)((long)pvVar2 + (long)(int)uVar6 + (ulong)uVar8) = (char)alpha_local;
        break;
      case 3:
        iVar4 = 3;
        if (uVar6 != 0) {
          iVar4 = 0;
        }
        *(char *)((long)pvVar2 + (long)iVar4 + (ulong)uVar8) = (char)image._4_4_;
      case 2:
        *(char *)((long)pvVar2 + (long)(int)(uVar6 + (uVar7 ^ 2)) + (ulong)uVar8) = (char)local_20;
        *(char *)((long)pvVar2 + (long)(int)(uVar6 + 1) + (ulong)uVar8) = (char)alpha_local;
        *(char *)((long)pvVar2 + (long)(int)(uVar6 + uVar7) + (ulong)uVar8) = (char)blue_local;
      }
    }
    return;
  }
  png_error(paVar1->opaque->png_ptr,"bad encoding (internal error)");
}

Assistant:

static void
png_create_colormap_entry(png_image_read_control *display,
    png_uint_32 ip, png_uint_32 red, png_uint_32 green, png_uint_32 blue,
    png_uint_32 alpha, int encoding)
{
   png_imagep image = display->image;
   const int output_encoding = (image->format & PNG_FORMAT_FLAG_LINEAR) != 0 ?
       P_LINEAR : P_sRGB;
   const int convert_to_Y = (image->format & PNG_FORMAT_FLAG_COLOR) == 0 &&
       (red != green || green != blue);

   if (ip > 255)
      png_error(image->opaque->png_ptr, "color-map index out of range");

   /* Update the cache with whether the file gamma is significantly different
    * from sRGB.
    */
   if (encoding == P_FILE)
   {
      if (display->file_encoding == P_NOTSET)
         set_file_encoding(display);

      /* Note that the cached value may be P_FILE too, but if it is then the
       * gamma_to_linear member has been set.
       */
      encoding = display->file_encoding;
   }

   if (encoding == P_FILE)
   {
      png_fixed_point g = display->gamma_to_linear;

      red = png_gamma_16bit_correct(red*257, g);
      green = png_gamma_16bit_correct(green*257, g);
      blue = png_gamma_16bit_correct(blue*257, g);

      if (convert_to_Y != 0 || output_encoding == P_LINEAR)
      {
         alpha *= 257;
         encoding = P_LINEAR;
      }

      else
      {
         red = PNG_sRGB_FROM_LINEAR(red * 255);
         green = PNG_sRGB_FROM_LINEAR(green * 255);
         blue = PNG_sRGB_FROM_LINEAR(blue * 255);
         encoding = P_sRGB;
      }
   }

   else if (encoding == P_LINEAR8)
   {
      /* This encoding occurs quite frequently in test cases because PngSuite
       * includes a gAMA 1.0 chunk with most images.
       */
      red *= 257;
      green *= 257;
      blue *= 257;
      alpha *= 257;
      encoding = P_LINEAR;
   }

   else if (encoding == P_sRGB &&
       (convert_to_Y  != 0 || output_encoding == P_LINEAR))
   {
      /* The values are 8-bit sRGB values, but must be converted to 16-bit
       * linear.
       */
      red = png_sRGB_table[red];
      green = png_sRGB_table[green];
      blue = png_sRGB_table[blue];
      alpha *= 257;
      encoding = P_LINEAR;
   }

   /* This is set if the color isn't gray but the output is. */
   if (encoding == P_LINEAR)
   {
      if (convert_to_Y != 0)
      {
         /* NOTE: these values are copied from png_do_rgb_to_gray */
         png_uint_32 y = (png_uint_32)6968 * red  + (png_uint_32)23434 * green +
            (png_uint_32)2366 * blue;

         if (output_encoding == P_LINEAR)
            y = (y + 16384) >> 15;

         else
         {
            /* y is scaled by 32768, we need it scaled by 255: */
            y = (y + 128) >> 8;
            y *= 255;
            y = PNG_sRGB_FROM_LINEAR((y + 64) >> 7);
            alpha = PNG_DIV257(alpha);
            encoding = P_sRGB;
         }

         blue = red = green = y;
      }

      else if (output_encoding == P_sRGB)
      {
         red = PNG_sRGB_FROM_LINEAR(red * 255);
         green = PNG_sRGB_FROM_LINEAR(green * 255);
         blue = PNG_sRGB_FROM_LINEAR(blue * 255);
         alpha = PNG_DIV257(alpha);
         encoding = P_sRGB;
      }
   }

   if (encoding != output_encoding)
      png_error(image->opaque->png_ptr, "bad encoding (internal error)");

   /* Store the value. */
   {
#     ifdef PNG_FORMAT_AFIRST_SUPPORTED
         const int afirst = (image->format & PNG_FORMAT_FLAG_AFIRST) != 0 &&
            (image->format & PNG_FORMAT_FLAG_ALPHA) != 0;
#     else
#        define afirst 0
#     endif
#     ifdef PNG_FORMAT_BGR_SUPPORTED
         const int bgr = (image->format & PNG_FORMAT_FLAG_BGR) != 0 ? 2 : 0;
#     else
#        define bgr 0
#     endif

      if (output_encoding == P_LINEAR)
      {
         png_uint_16p entry = png_voidcast(png_uint_16p, display->colormap);

         entry += ip * PNG_IMAGE_SAMPLE_CHANNELS(image->format);

         /* The linear 16-bit values must be pre-multiplied by the alpha channel
          * value, if less than 65535 (this is, effectively, composite on black
          * if the alpha channel is removed.)
          */
         switch (PNG_IMAGE_SAMPLE_CHANNELS(image->format))
         {
            case 4:
               entry[afirst ? 0 : 3] = (png_uint_16)alpha;
               /* FALLTHROUGH */

            case 3:
               if (alpha < 65535)
               {
                  if (alpha > 0)
                  {
                     blue = (blue * alpha + 32767U)/65535U;
                     green = (green * alpha + 32767U)/65535U;
                     red = (red * alpha + 32767U)/65535U;
                  }

                  else
                     red = green = blue = 0;
               }
               entry[afirst + (2 ^ bgr)] = (png_uint_16)blue;
               entry[afirst + 1] = (png_uint_16)green;
               entry[afirst + bgr] = (png_uint_16)red;
               break;

            case 2:
               entry[1 ^ afirst] = (png_uint_16)alpha;
               /* FALLTHROUGH */

            case 1:
               if (alpha < 65535)
               {
                  if (alpha > 0)
                     green = (green * alpha + 32767U)/65535U;

                  else
                     green = 0;
               }
               entry[afirst] = (png_uint_16)green;
               break;

            default:
               break;
         }
      }

      else /* output encoding is P_sRGB */
      {
         png_bytep entry = png_voidcast(png_bytep, display->colormap);

         entry += ip * PNG_IMAGE_SAMPLE_CHANNELS(image->format);

         switch (PNG_IMAGE_SAMPLE_CHANNELS(image->format))
         {
            case 4:
               entry[afirst ? 0 : 3] = (png_byte)alpha;
               /* FALLTHROUGH */
            case 3:
               entry[afirst + (2 ^ bgr)] = (png_byte)blue;
               entry[afirst + 1] = (png_byte)green;
               entry[afirst + bgr] = (png_byte)red;
               break;

            case 2:
               entry[1 ^ afirst] = (png_byte)alpha;
               /* FALLTHROUGH */
            case 1:
               entry[afirst] = (png_byte)green;
               break;

            default:
               break;
         }
      }

#     ifdef afirst
#        undef afirst
#     endif
#     ifdef bgr
#        undef bgr
#     endif
   }
}